

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O3

void __thiscall
Kernel::Signature::Symbol::addToDistinctGroup(Symbol *this,uint group,uint this_number)

{
  List<unsigned_int> *pLVar1;
  Stack<unsigned_int> *this_00;
  int *piVar2;
  long lVar3;
  List<unsigned_int> *pLVar4;
  uint *puVar5;
  void **head;
  DistinctGroupMembers members;
  
  pLVar1 = this->_distinctGroups;
  pLVar4 = (List<unsigned_int> *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pLVar4->_head = group;
  pLVar4->_tail = pLVar1;
  this->_distinctGroups = pLVar4;
  lVar3 = DAT_00b521b0;
  *(undefined1 *)(DAT_00b521b0 + 0x1c8) = 1;
  this_00 = *(Stack<unsigned_int> **)(*(long *)(lVar3 + 0x1b0) + (ulong)group * 0x10);
  piVar2 = *(int **)(*(long *)(lVar3 + 0x1b0) + 8 + (ulong)group * 0x10);
  if (piVar2 != (int *)0x0 && this_00 != (Stack<unsigned_int> *)0x0) {
    *piVar2 = *piVar2 + 1;
  }
  puVar5 = this_00->_cursor;
  if (puVar5 == this_00->_end) {
    Lib::Stack<unsigned_int>::expand(this_00);
    puVar5 = this_00->_cursor;
  }
  *puVar5 = this_number;
  this_00->_cursor = puVar5 + 1;
  if ((piVar2 != (int *)0x0) && (*piVar2 = *piVar2 + -1, *piVar2 == 0)) {
    checked_delete<Lib::Stack<unsigned_int>>(this_00);
    *(undefined8 *)piVar2 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = piVar2;
  }
  return;
}

Assistant:

void Signature::Symbol::addToDistinctGroup(unsigned group,unsigned this_number)
{
  ASS_EQ(arity(), 0);
  ASS(!List<unsigned>::member(group, _distinctGroups))

  List<unsigned>::push(group, _distinctGroups);
  env.signature->_distinctGroupsAddedTo=true;

  Signature::DistinctGroupMembers members = env.signature->_distinctGroupMembers[group];
  members->push(this_number);
}